

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_parser.c
# Opt level: O0

HT_ErrorCode set_global_timeline_buffer_size(int argc,char **argv,int pos)

{
  int *piVar1;
  ulong buffer_size;
  unsigned_long value;
  char *end;
  char *s;
  char **ppcStack_18;
  int pos_local;
  char **argv_local;
  int argc_local;
  
  if (pos + 1 < argc) {
    end = argv[pos + 1];
    s._4_4_ = pos;
    ppcStack_18 = argv;
    argv_local._0_4_ = argc;
    piVar1 = __errno_location();
    *piVar1 = 0;
    buffer_size = strtoul(end,(char **)&value,10);
    piVar1 = __errno_location();
    if (*piVar1 == 0x22) {
      argv_local._4_4_ = HT_ERR_OUT_OF_RANGE;
    }
    else if ((char *)value == end) {
      argv_local._4_4_ = HT_ERR_INVALID_FORMAT;
    }
    else {
      ht_global_timeline_set_buffer_size(buffer_size);
      argv_local._4_4_ = HT_ERR_OK;
    }
  }
  else {
    argv_local._4_4_ = HT_ERR_MISSING_ARGUMENT;
  }
  return argv_local._4_4_;
}

Assistant:

static HT_ErrorCode
set_global_timeline_buffer_size(int argc, char** argv, int pos)
{
    if (pos + 1 >= argc)
    {
        return HT_ERR_MISSING_ARGUMENT;
    }

    const char* s = argv[pos + 1];
    char* end;
    errno = 0;
    unsigned long value = strtoul(s, &end, 10);

    if (errno == ERANGE ||
        (sizeof(size_t) < sizeof(unsigned long) && (unsigned long)HT_SIZE_MAX < value))
    {
        return HT_ERR_OUT_OF_RANGE;
    }

    if (end - s == 0)
    {
        return HT_ERR_INVALID_FORMAT;
    }

    ht_global_timeline_set_buffer_size((size_t) value);
    return HT_ERR_OK;
}